

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::RepeatedField_ConstInit_Test::TestBody
          (RepeatedField_ConstInit_Test *this)

{
  bool bVar1;
  int iVar2;
  char *message;
  char *in_R9;
  string local_68;
  AssertHelper local_48 [3];
  Message local_30;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  RepeatedField_ConstInit_Test *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  if ((protobuf::(anonymous_namespace)::RepeatedField_ConstInit_Test::TestBody()::field == '\0') &&
     (iVar2 = __cxa_guard_acquire(&protobuf::(anonymous_namespace)::RepeatedField_ConstInit_Test::
                                   TestBody()::field), iVar2 != 0)) {
    __cxa_atexit(RepeatedField<int>::~RepeatedField,&TestBody::field,&__dso_handle);
    __cxa_guard_release(&protobuf::(anonymous_namespace)::RepeatedField_ConstInit_Test::TestBody()::
                         field);
  }
  local_21 = RepeatedField<int>::empty(&TestBody::field);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_20,(AssertionResult *)0x1ce0f38,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
               ,0x62,message);
    testing::internal::AssertHelper::operator=(local_48,&local_30);
    testing::internal::AssertHelper::~AssertHelper(local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(&local_30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST(RepeatedField, ConstInit) {
  PROTOBUF_CONSTINIT static RepeatedField<int> field{};  // NOLINT
  EXPECT_TRUE(field.empty());
}